

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

string * __thiscall
BooleanInstance::op_set
          (string *__return_storage_ptr__,BooleanInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  string *str;
  bool bVar1;
  int iVar2;
  undefined8 *puVar3;
  char *pcVar4;
  
  str = (arguments->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)str == 0x20) {
    bVar1 = Grammar::is_boolean_value(str);
    if (bVar1) {
      iVar2 = std::__cxx11::string::compare
                        ((char *)(arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
      this->_value = iVar2 == 0;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"null","");
      return __return_storage_ptr__;
    }
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar4 = "RuntimeError: invalid argument.";
  }
  else {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar4 = "RuntimeError: wrong number of arguments.";
  }
  *puVar3 = pcVar4;
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

std::string BooleanInstance::op_set(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    if (!Grammar::is_boolean_value(arguments[0]))
        throw EXC_INVALID_ARGUMENT;
    _value = (arguments[0] == "true");
    return "null";
}